

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall mpt::array::content::set_length(content *this,size_t len)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = *(long *)(this + 8);
  uVar2 = *(ulong *)(this + 0x10);
  if (len <= uVar2 && lVar1 == 0) {
    uVar3 = *(ulong *)(this + 0x18);
    if (uVar3 <= len && len - uVar3 != 0) {
      memset(this + uVar3 + 0x20,0,len - uVar3);
    }
    *(size_t *)(this + 0x18) = len;
  }
  return len <= uVar2 && lVar1 == 0;
}

Assistant:

bool array::content::set_length(size_t len)
{
	if (content_traits()) {
		return false;
	}
	if (len > _size) {
		return false;
	}
	if (len > _used) {
		uint8_t *ptr = static_cast<uint8_t *>(data());
		memset(ptr + _used, 0, len - _used);
	}
	_used = len;
	return true;
}